

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_measurement.cpp
# Opt level: O2

timeval timeval_minus(timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  timeval tVar4;
  
  lVar1 = t1->tv_usec;
  lVar2 = t2->tv_usec;
  lVar3 = (lVar1 - lVar2) + 1000000;
  if (lVar2 <= lVar1) {
    lVar3 = lVar1 - lVar2;
  }
  tVar4.tv_sec = (t1->tv_sec - t2->tv_sec) - (ulong)(lVar1 < lVar2);
  tVar4.tv_usec = lVar3;
  return tVar4;
}

Assistant:

timeval
timeval_minus( const struct timeval &t1, const struct timeval &t2 )
{
  timeval ret;
  ret.tv_sec = t1.tv_sec - t2.tv_sec;
  if( t1.tv_usec < t2.tv_usec )
  {
    ret.tv_sec--;
    ret.tv_usec = t1.tv_usec - t2.tv_usec + 1000000;
  }
  else
    ret.tv_usec = t1.tv_usec - t2.tv_usec;

  return ret;
}